

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseBreaks.cpp
# Opt level: O0

Expr * createListOfOneGoto(Block *container,Block *gotoTarget)

{
  _Base_ptr in_RDI;
  ExprList *result;
  __single_object list;
  Block *in_stack_00000050;
  Block *in_stack_00000058;
  vector<Expr_*,_std::allocator<Expr_*>_> exprs;
  __single_object gotoExpr;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffff68;
  pointer pEVar1;
  Block *in_stack_ffffffffffffff70;
  Block *this;
  unique_ptr<GotoExpr,_std::default_delete<GotoExpr>_> *in_stack_ffffffffffffff78;
  unique_ptr<Expr,_std::default_delete<Expr>_> *in_stack_ffffffffffffff80;
  vector<Expr_*,_std::allocator<Expr_*>_> *this_00;
  vector<Expr_*,_std::allocator<Expr_*>_> *in_stack_ffffffffffffff88;
  vector<Expr_*,_std::allocator<Expr_*>_> local_68;
  Func *local_48;
  _Base_ptr local_8;
  
  local_8 = in_RDI;
  std::make_unique<GotoExpr,Block*&>((Block **)in_stack_ffffffffffffff88);
  generatePhiAssignments(in_stack_00000058,in_stack_00000050);
  local_48 = (Func *)std::unique_ptr<GotoExpr,_std::default_delete<GotoExpr>_>::get
                               ((unique_ptr<GotoExpr,_std::default_delete<GotoExpr>_> *)
                                in_stack_ffffffffffffff70);
  std::vector<Expr_*,_std::allocator<Expr_*>_>::push_back
            ((vector<Expr_*,_std::allocator<Expr_*>_> *)in_stack_ffffffffffffff70,
             (value_type *)in_stack_ffffffffffffff68);
  std::make_unique<ExprList,std::vector<Expr*,std::allocator<Expr*>>>(in_stack_ffffffffffffff88);
  std::unique_ptr<Expr,std::default_delete<Expr>>::
  unique_ptr<GotoExpr,std::default_delete<GotoExpr>,void>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Block::addOwnership(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr(in_stack_ffffffffffffff80);
  this = (Block *)&stack0xffffffffffffffb0;
  local_68.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)std::unique_ptr<ExprList,_std::default_delete<ExprList>_>::get
                                 ((unique_ptr<ExprList,_std::default_delete<ExprList>_> *)this);
  this_00 = &local_68;
  std::unique_ptr<Expr,std::default_delete<Expr>>::
  unique_ptr<ExprList,std::default_delete<ExprList>,void>
            ((unique_ptr<Expr,_std::default_delete<Expr>_> *)this_00,
             (unique_ptr<ExprList,_std::default_delete<ExprList>_> *)local_8);
  Block::addOwnership(this,in_stack_ffffffffffffff68);
  std::unique_ptr<Expr,_std::default_delete<Expr>_>::~unique_ptr
            ((unique_ptr<Expr,_std::default_delete<Expr>_> *)this_00);
  pEVar1 = (pointer)local_68.super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
  std::unique_ptr<ExprList,_std::default_delete<ExprList>_>::~unique_ptr
            ((unique_ptr<ExprList,_std::default_delete<ExprList>_> *)this);
  std::vector<Expr_*,_std::allocator<Expr_*>_>::~vector(this_00);
  std::unique_ptr<GotoExpr,_std::default_delete<GotoExpr>_>::~unique_ptr
            ((unique_ptr<GotoExpr,_std::default_delete<GotoExpr>_> *)this);
  return (Expr *)pEVar1;
}

Assistant:

static Expr* createListOfOneGoto(Block* container, Block* gotoTarget) {
    auto gotoExpr = std::make_unique<GotoExpr>(gotoTarget);

    std::vector<Expr*> exprs = generatePhiAssignments(container, gotoTarget);
    exprs.push_back(gotoExpr.get());
    auto list = std::make_unique<ExprList>(std::move(exprs));

    container->addOwnership(std::move(gotoExpr));
    auto* result = list.get();
    container->addOwnership(std::move(list));
    return result;
}